

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O0

stack<util::variant,_std::deque<util::variant,_std::allocator<util::variant>_>_> *
util::rpn_parse(stack<util::variant,_std::deque<util::variant,_std::allocator<util::variant>_>_>
                *__return_storage_ptr__,string *expr)

{
  long lVar1;
  char *pcVar2;
  ulong uVar3;
  bool bVar4;
  variant local_d8;
  variant local_98;
  long local_48;
  size_t i;
  string tok;
  string *expr_local;
  stack<util::variant,_std::deque<util::variant,_std::allocator<util::variant>_>_> *stack;
  
  tok.super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
  super__Hash_node_code_cache<true>._M_hash_code._7_1_ = 0;
  std::stack<util::variant,std::deque<util::variant,std::allocator<util::variant>>>::
  stack<std::deque<util::variant,std::allocator<util::variant>>,void>
            ((stack<util::variant,std::deque<util::variant,std::allocator<util::variant>>> *)
             __return_storage_ptr__);
  std::__cxx11::string::string((string *)&i);
  lVar1 = std::__cxx11::string::length();
  local_48 = lVar1 + -1;
  do {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)expr);
    if (*pcVar2 == ' ') {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        rpn_parse_str_reverse((string *)&i);
        variant::variant(&local_98,(string *)&i);
        std::stack<util::variant,_std::deque<util::variant,_std::allocator<util::variant>_>_>::push
                  (__return_storage_ptr__,&local_98);
        variant::~variant(&local_98);
        std::__cxx11::string::clear();
      }
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)expr);
      std::__cxx11::string::operator+=((string *)&i,*pcVar2);
    }
    lVar1 = local_48 + -1;
    bVar4 = local_48 != 0;
    local_48 = lVar1;
  } while (bVar4);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    rpn_parse_str_reverse((string *)&i);
    variant::variant(&local_d8,(string *)&i);
    std::stack<util::variant,_std::deque<util::variant,_std::allocator<util::variant>_>_>::push
              (__return_storage_ptr__,&local_d8);
    variant::~variant(&local_d8);
  }
  tok.super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
  super__Hash_node_code_cache<true>._M_hash_code._7_1_ = 1;
  std::__cxx11::string::~string((string *)&i);
  if ((tok.super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
       super__Hash_node_code_cache<true>._M_hash_code._7_1_ & 1) == 0) {
    std::stack<util::variant,_std::deque<util::variant,_std::allocator<util::variant>_>_>::~stack
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::stack<util::variant> rpn_parse(std::string expr)
{
	std::stack<util::variant> stack;
	std::string tok;

	std::size_t i = expr.length() - 1;
	do
	{
		if (expr[i] != ' ')
		{
			tok += expr[i];
		}
		else if (!tok.empty())
		{
			rpn_parse_str_reverse(tok);
			stack.push(util::variant(tok));
			tok.clear();
		}
	} while (i-- != 0);

	if (!tok.empty())
	{
		rpn_parse_str_reverse(tok);
		stack.push(util::variant(tok));
	}

	return stack;
}